

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O0

int io_popen(lua_State *L)

{
  char *fname;
  LStream *pLVar1;
  int local_2c;
  LStream *p;
  char *mode;
  char *filename;
  lua_State *L_local;
  
  fname = luaL_checklstring(L,1,(size_t *)0x0);
  luaL_optlstring(L,2,"r",(size_t *)0x0);
  pLVar1 = newprefile(L);
  luaL_error(L,"\'popen\' not supported");
  pLVar1->f = (FILE *)0x0;
  pLVar1->closef = io_pclose;
  if (pLVar1->f == (FILE *)0x0) {
    local_2c = luaL_fileresult(L,0,fname);
  }
  else {
    local_2c = 1;
  }
  return local_2c;
}

Assistant:

static int io_popen (lua_State *L) {
  const char *filename = luaL_checkstring(L, 1);
  const char *mode = luaL_optstring(L, 2, "r");
  LStream *p = newprefile(L);
  p->f = l_popen(L, filename, mode);
  p->closef = &io_pclose;
  return (p->f == NULL) ? luaL_fileresult(L, 0, filename) : 1;
}